

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O0

int mbedtls_rsa_rsaes_pkcs1_v15_decrypt
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              size_t *olen,uchar *input,uchar *output,size_t output_max_len)

{
  long in_RDI;
  uchar buf [1024];
  size_t ilen;
  int ret;
  size_t in_stack_fffffffffffffbb8;
  void *in_stack_fffffffffffffbc0;
  size_t *in_stack_fffffffffffffc20;
  size_t in_stack_fffffffffffffc28;
  uchar *in_stack_fffffffffffffc30;
  size_t in_stack_fffffffffffffc38;
  uchar *in_stack_fffffffffffffc40;
  uchar *in_stack_fffffffffffffc68;
  uchar *in_stack_fffffffffffffc70;
  void *in_stack_fffffffffffffc78;
  _func_int_void_ptr_uchar_ptr_size_t *in_stack_fffffffffffffc80;
  mbedtls_rsa_context *in_stack_fffffffffffffc88;
  undefined4 local_3c;
  undefined4 local_4;
  
  if (*(int *)(in_RDI + 0xe0) == 0) {
    if ((*(ulong *)(in_RDI + 8) < 0x10) || (0x400 < *(ulong *)(in_RDI + 8))) {
      local_4 = -0x4080;
    }
    else {
      local_3c = mbedtls_rsa_private(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
                                     in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
                                     in_stack_fffffffffffffc68);
      if (local_3c == 0) {
        local_3c = mbedtls_ct_rsaes_pkcs1_v15_unpadding
                             (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
                              in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                              in_stack_fffffffffffffc20);
      }
      mbedtls_platform_zeroize(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
      local_4 = local_3c;
    }
  }
  else {
    local_4 = -0x4080;
  }
  return local_4;
}

Assistant:

int mbedtls_rsa_rsaes_pkcs1_v15_decrypt(mbedtls_rsa_context *ctx,
                                        int (*f_rng)(void *, unsigned char *, size_t),
                                        void *p_rng,
                                        size_t *olen,
                                        const unsigned char *input,
                                        unsigned char *output,
                                        size_t output_max_len)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t ilen;
    unsigned char buf[MBEDTLS_MPI_MAX_SIZE];

    ilen = ctx->len;

    if (ctx->padding != MBEDTLS_RSA_PKCS_V15) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    if (ilen < 16 || ilen > sizeof(buf)) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    ret = mbedtls_rsa_private(ctx, f_rng, p_rng, input, buf);

    if (ret != 0) {
        goto cleanup;
    }

    ret = mbedtls_ct_rsaes_pkcs1_v15_unpadding(buf, ilen,
                                               output, output_max_len, olen);

cleanup:
    mbedtls_platform_zeroize(buf, sizeof(buf));

    return ret;
}